

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * __thiscall
JSON::JSONValue::toString_abi_cxx11_(string *__return_storage_ptr__,JSONValue *this,int indent)

{
  ulong uVar1;
  JSONValueType JVar2;
  string *psVar3;
  ulong uVar4;
  char *pcVar5;
  longlong *plVar6;
  JSONArray *arr;
  JSONObject *this_00;
  bool *pbVar7;
  double dVar8;
  string local_200;
  ulong local_1e0;
  size_t i;
  string toprint;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [380];
  int local_1c;
  JSONValue *pJStack_18;
  int indent_local;
  JSONValue *this_local;
  
  local_1c = indent;
  pJStack_18 = this;
  this_local = (JSONValue *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  JVar2 = getType(this);
  switch(JVar2) {
  case STRING:
    psVar3 = getStringValue_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&i,(string *)psVar3);
    std::operator<<(local_198,"\"");
    for (local_1e0 = 0; uVar1 = local_1e0, uVar4 = std::__cxx11::string::size(), uVar1 < uVar4;
        local_1e0 = local_1e0 + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&i);
      if (*pcVar5 == '\"') {
        std::operator<<(local_198,"\\\"");
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&i);
        std::operator<<(local_198,*pcVar5);
      }
    }
    std::operator<<(local_198,"\"");
    std::__cxx11::string::~string((string *)&i);
    break;
  case INTEGER:
    plVar6 = getIntValue(this);
    std::ostream::operator<<(local_198,*plVar6);
    break;
  case DOUBLE:
    dVar8 = getDoubleValue(this);
    std::ostream::operator<<(local_198,dVar8);
    break;
  case ARRAY:
    arr = getArrayValue(this);
    operator<<(local_198,arr);
    break;
  case OBJECT:
    this_00 = getObjectValue(this);
    JSONObject::toString_abi_cxx11_(&local_200,this_00,local_1c + 2);
    std::operator<<(local_198,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    break;
  case BOOLEAN:
    pbVar7 = getBoolValue(this);
    if ((*pbVar7 & 1U) == 1) {
      std::operator<<(local_198,"true");
    }
    else {
      std::operator<<(local_198,"false");
    }
    break;
  case JSONNULL:
    std::operator<<(local_198,"null");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string JSONValue::toString(int indent) const {
	stringstream out;
	switch(getType()) {
		case STRING:
			{
				string toprint=getStringValue();
				out << "\"";
				for(size_t i=0;i<toprint.size();i++)
					if(toprint[i]=='"')
						out << "\\\"";
					else
						out << toprint[i];
				out << "\"";
				break;
			}
		case INTEGER:
			out << getIntValue();
			break;
		case DOUBLE:
			out << getDoubleValue();
			break;
		case ARRAY:
			out << getArrayValue();
			break;
		case OBJECT:
			out << getObjectValue().toString(indent+2);
			break;
		case BOOLEAN:
			if(getBoolValue()==true)
				out << "true";
			else
				out << "false";
			break;
		case JSONNULL:
			out << "null";
			break;
	}
	return out.str();
}